

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_curves.cpp
# Opt level: O1

int __thiscall agg::curve4_inc::init(curve4_inc *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  double dVar5;
  double in_XMM2_Qa;
  double dVar6;
  double in_XMM3_Qa;
  double dVar7;
  double in_XMM4_Qa;
  double dVar8;
  double dVar9;
  double in_XMM5_Qa;
  double in_XMM6_Qa;
  double in_XMM7_Qa;
  double dVar10;
  double dVar11;
  
  *(double *)(this + 0x10) = in_XMM0_Qa;
  *(double *)(this + 0x18) = in_XMM1_Qa;
  *(double *)(this + 0x20) = in_XMM6_Qa;
  *(double *)(this + 0x28) = in_XMM7_Qa;
  dVar3 = in_XMM2_Qa - in_XMM0_Qa;
  dVar5 = in_XMM3_Qa - in_XMM1_Qa;
  dVar4 = dVar3 * dVar3 + dVar5 * dVar5;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar8 = (in_XMM4_Qa - in_XMM2_Qa) * (in_XMM4_Qa - in_XMM2_Qa) +
          (in_XMM5_Qa - in_XMM3_Qa) * (in_XMM5_Qa - in_XMM3_Qa);
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  dVar6 = (in_XMM6_Qa - in_XMM4_Qa) * (in_XMM6_Qa - in_XMM4_Qa) +
          (in_XMM7_Qa - in_XMM5_Qa) * (in_XMM7_Qa - in_XMM5_Qa);
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  iVar2 = (int)(long)((dVar4 + dVar8 + dVar6) * 0.25 * *(double *)(this + 8) + 0.5);
  iVar1 = 4;
  if (4 < iVar2) {
    iVar1 = iVar2;
  }
  dVar6 = 1.0 / (double)iVar1;
  dVar7 = dVar6 * dVar6;
  dVar8 = (in_XMM0_Qa - (in_XMM2_Qa + in_XMM2_Qa)) + in_XMM4_Qa;
  dVar11 = ((in_XMM2_Qa - in_XMM4_Qa) * 3.0 - in_XMM0_Qa) + in_XMM6_Qa;
  dVar4 = (in_XMM1_Qa - (in_XMM3_Qa + in_XMM3_Qa)) + in_XMM5_Qa;
  dVar10 = ((in_XMM3_Qa - in_XMM5_Qa) * 3.0 - in_XMM1_Qa) + in_XMM7_Qa;
  *(int *)this = iVar1;
  *(double *)(this + 0x30) = in_XMM0_Qa;
  *(double *)(this + 0x70) = in_XMM0_Qa;
  dVar9 = dVar6 * dVar7;
  *(double *)(this + 0x38) = in_XMM1_Qa;
  *(double *)(this + 0x78) = in_XMM1_Qa;
  dVar3 = dVar11 * dVar9 + dVar3 * dVar6 * 3.0 + dVar8 * dVar7 * 3.0;
  *(double *)(this + 0x40) = dVar3;
  *(double *)(this + 0x80) = dVar3;
  dVar3 = dVar9 * dVar10 + dVar5 * dVar6 * 3.0 + dVar7 * 3.0 * dVar4;
  *(double *)(this + 0x48) = dVar3;
  *(double *)(this + 0x88) = dVar3;
  dVar11 = dVar11 * dVar9 * 6.0;
  dVar3 = dVar8 * dVar7 * 6.0 + dVar11;
  *(double *)(this + 0x50) = dVar3;
  *(double *)(this + 0x90) = dVar3;
  dVar10 = dVar10 * dVar9 * 6.0;
  dVar3 = dVar4 * dVar7 * 6.0 + dVar10;
  *(double *)(this + 0x58) = dVar3;
  *(double *)(this + 0x98) = dVar3;
  *(double *)(this + 0x60) = dVar11;
  *(double *)(this + 0x68) = dVar10;
  *(int *)(this + 4) = iVar1;
  return iVar1;
}

Assistant:

void curve4_inc::init(double x1, double y1, 
                          double x2, double y2, 
                          double x3, double y3,
                          double x4, double y4)
    {
        m_start_x = x1;
        m_start_y = y1;
        m_end_x   = x4;
        m_end_y   = y4;

        double dx1 = x2 - x1;
        double dy1 = y2 - y1;
        double dx2 = x3 - x2;
        double dy2 = y3 - y2;
        double dx3 = x4 - x3;
        double dy3 = y4 - y3;

        double len = (sqrt(dx1 * dx1 + dy1 * dy1) + 
                      sqrt(dx2 * dx2 + dy2 * dy2) + 
                      sqrt(dx3 * dx3 + dy3 * dy3)) * 0.25 * m_scale;

#if defined(_MSC_VER) && _MSC_VER <= 1200
        m_num_steps = uround(MSC60_fix_ICE(len));
#else
        m_num_steps = uround(len);
#endif

        if(m_num_steps < 4)
        {
            m_num_steps = 4;   
        }

        double subdivide_step  = 1.0 / m_num_steps;
        double subdivide_step2 = subdivide_step * subdivide_step;
        double subdivide_step3 = subdivide_step * subdivide_step * subdivide_step;

        double pre1 = 3.0 * subdivide_step;
        double pre2 = 3.0 * subdivide_step2;
        double pre4 = 6.0 * subdivide_step2;
        double pre5 = 6.0 * subdivide_step3;
	
        double tmp1x = x1 - x2 * 2.0 + x3;
        double tmp1y = y1 - y2 * 2.0 + y3;

        double tmp2x = (x2 - x3) * 3.0 - x1 + x4;
        double tmp2y = (y2 - y3) * 3.0 - y1 + y4;

        m_saved_fx = m_fx = x1;
        m_saved_fy = m_fy = y1;

        m_saved_dfx = m_dfx = (x2 - x1) * pre1 + tmp1x * pre2 + tmp2x * subdivide_step3;
        m_saved_dfy = m_dfy = (y2 - y1) * pre1 + tmp1y * pre2 + tmp2y * subdivide_step3;

        m_saved_ddfx = m_ddfx = tmp1x * pre4 + tmp2x * pre5;
        m_saved_ddfy = m_ddfy = tmp1y * pre4 + tmp2y * pre5;

        m_dddfx = tmp2x * pre5;
        m_dddfy = tmp2y * pre5;

        m_step = m_num_steps;
    }